

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void ImPlot::ShowAltLegend
               (char *title_id,ImPlotOrientation orientation,ImVec2 size,bool interactable)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImGuiWindow *this;
  ImDrawList *this_00;
  ImVec2 IVar6;
  ImVec4 *pIVar7;
  ImGuiContext *pIVar8;
  ImPlotContext *pIVar9;
  bool bVar10;
  ImGuiID key;
  ImU32 IVar11;
  uint uVar12;
  ImPlotPlot *plot;
  ImVec4 *pIVar13;
  ImGuiIO *pIVar14;
  float *pfVar15;
  ImGuiWindow *Window;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  float fVar16;
  float fVar17;
  ImRect bb_frame;
  ImRect legend_bb;
  ImRect local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ImRect local_68;
  ImVec4 local_58;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar9 = GImPlot;
  pIVar8 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return;
  }
  local_88._8_4_ = in_XMM0_Dc;
  local_88._0_8_ = size;
  local_88._12_4_ = in_XMM0_Dd;
  this_00 = this->DrawList;
  key = ImGuiWindow::GetID(this,title_id,(char *)0x0);
  plot = ImPool<ImPlotPlot>::GetByKey(&GImPlot->Plots,key);
  if (plot == (ImPlotPlot *)0x0) {
    IVar3 = (pIVar9->Style).LegendPadding;
    fVar16 = IVar3.x;
    fVar17 = IVar3.y;
    fVar16 = fVar16 + fVar16;
    fVar17 = fVar17 + fVar17;
    local_78 = ZEXT816(0);
  }
  else {
    IVar6 = CalcLegendSize(plot,&(pIVar9->Style).LegendInnerPadding,&(pIVar9->Style).LegendSpacing,
                           orientation);
    IVar3 = (pIVar9->Style).LegendPadding;
    fVar16 = IVar3.x;
    fVar17 = IVar3.y;
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = IVar6.x;
    local_78._4_4_ = IVar6.y;
    local_78._12_4_ = extraout_XMM0_Dd;
    fVar16 = fVar16 + fVar16 + IVar6.x;
    fVar17 = fVar17 + fVar17 + IVar6.y;
  }
  IVar3 = ImGui::CalcItemSize((ImVec2)local_88._0_8_,fVar16,fVar17);
  local_98.Min.x = (this->DC).CursorPos.x;
  local_98.Min.y = (this->DC).CursorPos.y;
  local_98.Max.x = IVar3.x + local_98.Min.x;
  local_98.Max.y = IVar3.y + local_98.Min.y;
  ImGui::ItemSize(&local_98,-1.0);
  bVar10 = ImGui::ItemAdd(&local_98,0,&local_98,0);
  if (!bVar10) {
    return;
  }
  local_88._4_4_ = local_98.Min.y;
  local_88._0_4_ = local_98.Min.x;
  local_88._8_8_ = 0;
  local_48.y = local_98.Max.y;
  local_48.x = local_98.Max.x;
  uStack_40 = 0;
  fVar16 = (GImPlot->Style).Colors[5].w;
  if ((fVar16 != -1.0) || (NAN(fVar16))) {
    pIVar13 = (GImPlot->Style).Colors + 5;
    pIVar7 = (GImPlot->Style).Colors + 5;
  }
  else {
    pIVar13 = ImGui::GetStyleColorVec4(7);
    pIVar7 = pIVar13;
  }
  local_58.x = pIVar13->x;
  local_58.y = pIVar13->y;
  uVar1 = pIVar7->z;
  uVar4 = pIVar7->w;
  local_58.z = (float)uVar1;
  local_58.w = (float)uVar4;
  IVar11 = ImGui::ColorConvertFloat4ToU32(&local_58);
  ImGui::RenderFrame((ImVec2)local_88._0_8_,local_48,IVar11,true,(pIVar8->Style).FrameRounding);
  IVar3.y = local_98.Min.y;
  IVar3.x = local_98.Min.x;
  IVar6.y = local_98.Max.y;
  IVar6.x = local_98.Max.x;
  ImDrawList::PushClipRect(this_00,IVar3,IVar6,true);
  if (plot == (ImPlotPlot *)0x0) goto LAB_001b789d;
  local_68.Min.x =
       (float)(int)(((local_98.Max.x + local_98.Min.x) * 0.5 - (float)local_78._0_4_ * 0.5) + 0.5);
  local_68.Min.y =
       (float)(int)(((local_98.Max.y + local_98.Min.y) * 0.5 - (float)local_78._4_4_ * 0.5) + 0.5);
  local_68.Max.x = (float)local_78._0_4_ + local_68.Min.x;
  local_68.Max.y = (float)local_78._4_4_ + local_68.Min.y;
  if (interactable) {
    pIVar14 = ImGui::GetIO();
    fVar16 = (pIVar14->MousePos).x;
    if (fVar16 < local_98.Min.x) goto LAB_001b7731;
    fVar17 = (pIVar14->MousePos).y;
    uVar12 = 0;
    if ((local_98.Min.y <= fVar17) && (fVar16 < local_98.Max.x)) {
      uVar12 = (uint)(fVar17 < local_98.Max.y);
    }
  }
  else {
LAB_001b7731:
    uVar12 = 0;
  }
  local_88._0_4_ = uVar12;
  fVar16 = (GImPlot->Style).Colors[8].w;
  if ((fVar16 != -1.0) || (NAN(fVar16))) {
    pIVar13 = (GImPlot->Style).Colors + 8;
    pIVar7 = (GImPlot->Style).Colors + 8;
  }
  else {
    pIVar13 = ImGui::GetStyleColorVec4(4);
    pIVar7 = pIVar13;
  }
  local_58.x = pIVar13->x;
  local_58.y = pIVar13->y;
  uVar2 = pIVar7->z;
  uVar5 = pIVar7->w;
  local_58.z = (float)uVar2;
  local_58.w = (float)uVar5;
  IVar11 = ImGui::ColorConvertFloat4ToU32(&local_58);
  local_78._0_4_ = IVar11;
  fVar16 = (GImPlot->Style).Colors[9].w;
  if ((fVar16 != -1.0) || (NAN(fVar16))) {
    pIVar13 = (GImPlot->Style).Colors + 9;
    pfVar15 = &(GImPlot->Style).Colors[9].z;
  }
  else {
    fVar16 = (GImPlot->Style).Colors[7].w;
    if ((fVar16 != -1.0) || (NAN(fVar16))) {
      pIVar13 = (GImPlot->Style).Colors + 7;
      pfVar15 = &(GImPlot->Style).Colors[7].z;
    }
    else {
      pIVar13 = ImGui::GetStyleColorVec4(5);
      pfVar15 = &pIVar13->z;
    }
  }
  local_58.x = pIVar13->x;
  local_58.y = pIVar13->y;
  local_58.z = (float)*(undefined8 *)pfVar15;
  local_58.w = (float)((ulong)*(undefined8 *)pfVar15 >> 0x20);
  IVar11 = ImGui::ColorConvertFloat4ToU32(&local_58);
  ImDrawList::AddRectFilled(this_00,&local_68.Min,&local_68.Max,local_78._0_4_,0.0,0);
  ImDrawList::AddRect(this_00,&local_68.Min,&local_68.Max,IVar11,0.0,0,1.0);
  ShowLegendEntries(plot,&local_68,local_88[0],&(pIVar9->Style).LegendInnerPadding,
                    &(pIVar9->Style).LegendSpacing,orientation,this_00);
LAB_001b789d:
  ImDrawList::PopClipRect(this_00);
  return;
}

Assistant:

void ShowAltLegend(const char* title_id, ImPlotOrientation orientation, const ImVec2 size, bool interactable) {
    ImPlotContext& gp    = *GImPlot;
    ImGuiContext &G      = *GImGui;
    ImGuiWindow * Window = G.CurrentWindow;
    if (Window->SkipItems)
        return;
    ImDrawList &DrawList = *Window->DrawList;
    ImPlotPlot* plot = GetPlot(title_id);
    ImVec2 legend_size;
    ImVec2 default_size = gp.Style.LegendPadding * 2;
    if (plot != NULL) {
        legend_size  = CalcLegendSize(*plot, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, orientation);
        default_size = legend_size + gp.Style.LegendPadding * 2;
    }
    ImVec2 frame_size = ImGui::CalcItemSize(size, default_size.x, default_size.y);
    ImRect bb_frame = ImRect(Window->DC.CursorPos, Window->DC.CursorPos + frame_size);
    ImGui::ItemSize(bb_frame);
    if (!ImGui::ItemAdd(bb_frame, 0, &bb_frame))
        return;
    ImGui::RenderFrame(bb_frame.Min, bb_frame.Max, GetStyleColorU32(ImPlotCol_FrameBg), true, G.Style.FrameRounding);
    DrawList.PushClipRect(bb_frame.Min, bb_frame.Max, true);
    if (plot != NULL) {
        const ImVec2 legend_pos  = GetLocationPos(bb_frame, legend_size, 0, gp.Style.LegendPadding);
        const ImRect legend_bb(legend_pos, legend_pos + legend_size);
        interactable = interactable && bb_frame.Contains(ImGui::GetIO().MousePos);
        // render legend box
        ImU32  col_bg      = GetStyleColorU32(ImPlotCol_LegendBg);
        ImU32  col_bd      = GetStyleColorU32(ImPlotCol_LegendBorder);
        DrawList.AddRectFilled(legend_bb.Min, legend_bb.Max, col_bg);
        DrawList.AddRect(legend_bb.Min, legend_bb.Max, col_bd);
        // render entries
        ShowLegendEntries(*plot, legend_bb, interactable, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, orientation, DrawList);
    }
    DrawList.PopClipRect();
}